

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O0

void __thiscall
soul::
ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
::reserve(ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
          *this,size_t minSize)

{
  unsigned_long uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ulong local_28;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *newObjects;
  size_t minSize_local;
  ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  *this_local;
  
  if (this->numAllocated < minSize) {
    uVar1 = getAlignedSize<16,unsigned_long>(minSize);
    if (4 < uVar1) {
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new__(uVar1 << 5);
      for (local_28 = 0; local_28 < this->numActive; local_28 = local_28 + 1) {
        std::__cxx11::string::string
                  ((string *)(pbVar2 + local_28),(string *)(this->items + local_28));
        std::__cxx11::string::~string((string *)(this->items + local_28));
      }
      freeIfHeapAllocated(this);
      this->items = pbVar2;
    }
    this->numAllocated = uVar1;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }